

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

Block * __thiscall
VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>
          (VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *this)

{
  size_t sVar1;
  long lVar2;
  ItemBlock *pIVar3;
  Item *pIVar4;
  uint32_t uVar5;
  ulong uVar6;
  
  sVar1 = (this->m_ItemBlocks).m_Count;
  lVar2 = sVar1 + 1;
  pIVar3 = (this->m_ItemBlocks).m_pArray + sVar1;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      pIVar3 = CreateNewBlock(this);
      pIVar4 = pIVar3->pItems;
      uVar5 = pIVar4->NextFreeIndex;
      goto LAB_001c3a4a;
    }
    uVar6 = (ulong)pIVar3[-1].FirstFreeIndex;
    pIVar3 = pIVar3 + -1;
  } while (uVar6 == 0xffffffff);
  pIVar4 = pIVar3->pItems + uVar6;
  uVar5 = pIVar3->pItems[uVar6].NextFreeIndex;
LAB_001c3a4a:
  pIVar3->FirstFreeIndex = uVar5;
  *(char *)((long)pIVar4 + 0x20) = '\0';
  *(char *)((long)pIVar4 + 0x21) = '\0';
  *(char *)((long)pIVar4 + 0x22) = '\0';
  *(char *)((long)pIVar4 + 0x23) = '\0';
  *(char *)((long)pIVar4 + 0x24) = '\0';
  *(char *)((long)pIVar4 + 0x25) = '\0';
  *(char *)((long)pIVar4 + 0x26) = '\0';
  *(char *)((long)pIVar4 + 0x27) = '\0';
  *(char *)((long)pIVar4 + 0x28) = '\0';
  *(char *)((long)pIVar4 + 0x29) = '\0';
  *(char *)((long)pIVar4 + 0x2a) = '\0';
  *(char *)((long)pIVar4 + 0x2b) = '\0';
  *(char *)((long)pIVar4 + 0x2c) = '\0';
  *(char *)((long)pIVar4 + 0x2d) = '\0';
  *(char *)((long)pIVar4 + 0x2e) = '\0';
  *(char *)((long)pIVar4 + 0x2f) = '\0';
  *(char *)((long)pIVar4 + 0x10) = '\0';
  *(char *)((long)pIVar4 + 0x11) = '\0';
  *(char *)((long)pIVar4 + 0x12) = '\0';
  *(char *)((long)pIVar4 + 0x13) = '\0';
  *(char *)((long)pIVar4 + 0x14) = '\0';
  *(char *)((long)pIVar4 + 0x15) = '\0';
  *(char *)((long)pIVar4 + 0x16) = '\0';
  *(char *)((long)pIVar4 + 0x17) = '\0';
  *(char *)((long)pIVar4 + 0x18) = '\0';
  *(char *)((long)pIVar4 + 0x19) = '\0';
  *(char *)((long)pIVar4 + 0x1a) = '\0';
  *(char *)((long)pIVar4 + 0x1b) = '\0';
  *(char *)((long)pIVar4 + 0x1c) = '\0';
  *(char *)((long)pIVar4 + 0x1d) = '\0';
  *(char *)((long)pIVar4 + 0x1e) = '\0';
  *(char *)((long)pIVar4 + 0x1f) = '\0';
  *(undefined8 *)pIVar4 = 0;
  *(char *)((long)pIVar4 + 8) = '\0';
  *(char *)((long)pIVar4 + 9) = '\0';
  *(char *)((long)pIVar4 + 10) = '\0';
  *(char *)((long)pIVar4 + 0xb) = '\0';
  *(char *)((long)pIVar4 + 0xc) = '\0';
  *(char *)((long)pIVar4 + 0xd) = '\0';
  *(char *)((long)pIVar4 + 0xe) = '\0';
  *(char *)((long)pIVar4 + 0xf) = '\0';
  return (Block *)pIVar4;
}

Assistant:

T* VmaPoolAllocator<T>::Alloc(Types&&... args)
{
    for (size_t i = m_ItemBlocks.size(); i--; )
    {
        ItemBlock& block = m_ItemBlocks[i];
        // This block has some free items: Use first one.
        if (block.FirstFreeIndex != UINT32_MAX)
        {
            Item* const pItem = &block.pItems[block.FirstFreeIndex];
            block.FirstFreeIndex = pItem->NextFreeIndex;
            T* result = (T*)&pItem->Value;
            new(result)T(std::forward<Types>(args)...); // Explicit constructor call.
            return result;
        }
    }

    // No block has free item: Create new one and use it.
    ItemBlock& newBlock = CreateNewBlock();
    Item* const pItem = &newBlock.pItems[0];
    newBlock.FirstFreeIndex = pItem->NextFreeIndex;
    T* result = (T*)&pItem->Value;
    new(result) T(std::forward<Types>(args)...); // Explicit constructor call.
    return result;
}